

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portioner.cpp
# Opt level: O2

void __thiscall Portioner::make_Portion(Portioner *this)

{
  int iVar1;
  undefined1 auVar2 [8];
  pointer pPVar3;
  ostream *poVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer __x;
  ulong uVar8;
  undefined1 auStack_78 [8];
  vector<Point_d,_std::allocator<Point_d>_> bucket;
  ulong local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  local_34 = this->_Y_Bucketsize;
  iVar6 = 99999;
  iVar5 = 0;
  local_48 = 0;
  local_38 = 0;
  for (; local_34 <= this->_height; local_34 = local_34 + this->_Y_Bucketsize) {
    iVar7 = this->_X_Bucketsize;
    local_3c = 0;
    for (; iVar7 <= this->_width; iVar7 = iVar7 + iVar1) {
      auStack_78 = (undefined1  [8])0x0;
      bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      for (__x = (this->_random_points).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          pPVar3 = bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                   super__Vector_impl_data._M_start, auVar2 = auStack_78,
          __x != (this->_random_points).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                 _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
        if ((((__x->x < (double)iVar7) && ((double)local_3c <= __x->x)) &&
            (__x->y < (double)local_34)) && ((double)local_38 <= __x->y)) {
          std::vector<Point_d,_std::allocator<Point_d>_>::push_back
                    ((vector<Point_d,_std::allocator<Point_d>_> *)auStack_78,__x);
        }
      }
      std::
      vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
      ::push_back(&this->_point_buckets,(value_type *)auStack_78);
      uVar8 = (long)pPVar3 - (long)auVar2 >> 5;
      if ((ulong)(long)(int)local_48 < uVar8) {
        local_48 = uVar8;
      }
      local_48 = local_48 & 0xffffffff;
      if (uVar8 < (ulong)(long)iVar6) {
        iVar6 = (int)uVar8;
      }
      iVar5 = iVar5 + 1;
      iVar1 = this->_X_Bucketsize;
      local_3c = local_3c + iVar1;
      std::_Vector_base<Point_d,_std::allocator<Point_d>_>::~_Vector_base
                ((_Vector_base<Point_d,_std::allocator<Point_d>_> *)auStack_78);
    }
    local_38 = local_38 + this->_Y_Bucketsize;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"es gibt ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar5);
  poVar4 = std::operator<<(poVar4," Buckets. ");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Bucketmaxsize ist  ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)local_48);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Bucketminsize ist  ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar6);
  std::operator<<(poVar4,"\n");
  return;
}

Assistant:

void Portioner::make_Portion()
{
  int bucketcounter = 0;
  int minbucketsize = 99999;
  int maxbucketsize = 0;
//  std::vector<std::vector<Point_d>>Point_bucket;
  int ybmin = 0;
  int ybmax = _Y_Bucketsize;
  //std::cout << "ybmin is now: " <<ybmin<< "  . " <<"\n";
  //std::cout << "ybmax is now" <<ybmax<< "  . " <<"\n";
  while(ybmax <= _height)
    {
      //std::cout << "outer while loop starts: ----------------------" <<"\n";
      int xbmin = 0;
      int xbmax = _X_Bucketsize;
      //std::cout << "xbmin is now: " <<xbmin<< "  . " <<"\n";
      //std::cout << "xbmax is now" <<xbmax<< "  . " <<"\n";
      while(xbmax <=_width)
      {
        std::vector<Point_d>bucket;
        for(auto it = std::begin(_random_points); it!=std::end(_random_points); ++it){
          if(it->x < xbmax && it->x >= xbmin){
            if(it->y < ybmax && it->y >= ybmin){
              //noch ganz schön langsam da random_points nicht kleiner wird
              bucket.push_back(*it);
            }
          }
        }
        //std::cout << "Bucket ist mit  " <<bucket.size()<< " gefüllt. " <<"\n";
        if(minbucketsize > bucket.size())minbucketsize = bucket.size();
        if(maxbucketsize < bucket.size())maxbucketsize = bucket.size();
        _point_buckets.push_back(bucket);
        bucketcounter += 1;
        xbmin = xbmin+_X_Bucketsize;
        xbmax = xbmax+_X_Bucketsize;
        //std::cout << "xbmin is now: " <<xbmin<< "  . " <<"\n";
        //std::cout << "xbmax is now" <<xbmax<< "  . " <<"\n";
      }
      //std::cout << "left inner while loop:    -->>-<-<-<-<-<-<-<-<-<-<-<-     " <<"\n";
      xbmin = 0;
      xbmax = 0 + _X_Bucketsize;
      //std::cout << "xbmin is now: " <<xbmin<< "  . " <<"\n";
      //std::cout << "xbmax is now" <<xbmax<< "  . " <<"\n";
      ybmin = ybmin + _Y_Bucketsize;
      ybmax = ybmax + _Y_Bucketsize;
      //std::cout << "ybmin is now: " <<ybmin<< "  . " <<"\n";
      //std::cout << "ybmax is now" <<ybmax<< "  . " <<"\n";

    }
    std::cout << "es gibt " <<bucketcounter<< " Buckets. " <<"\n";
    std::cout << "Bucketmaxsize ist  " << maxbucketsize  <<"\n";
    std::cout << "Bucketminsize ist  " << minbucketsize  <<"\n";


    //return _point_buckets;
    return;
}